

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall
HModel::util_addRows
          (HModel *this,int nrows,double *XrowLower,double *XrowUpper,int nnonz,int *XARstart,
          int *XARindex,double *XARvalue)

{
  long lVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  bool bVar7;
  long lVar8;
  undefined4 in_register_00000034;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  size_type sVar13;
  long lVar14;
  vector<int,_std::allocator<int>_> Alength;
  vector<int,_std::allocator<int>_> local_78;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  size_type local_48;
  ulong local_40;
  value_type local_34;
  
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n",CONCAT44(in_register_00000034,nrows),
         (ulong)(uint)nnonz);
  std::ostream::flush();
  puts("H2DEBUG is being set OK");
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n",(ulong)(uint)nrows,nnonz);
  std::ostream::flush();
  if (nrows != 0) {
    sVar13 = (long)nrows + (long)this->numRow;
    std::vector<double,_std::allocator<double>_>::resize(&this->rowLower,sVar13);
    std::vector<double,_std::allocator<double>_>::resize(&this->rowUpper,sVar13);
    std::vector<double,_std::allocator<double>_>::resize(&this->rowScale,sVar13);
    if (0 < nrows) {
      lVar8 = (long)this->numRow;
      pdVar2 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      do {
        pdVar2[lVar8 + uVar9] = XrowLower[uVar9];
        pdVar3[lVar8 + uVar9] = XrowUpper[uVar9];
        pdVar4[lVar8 + uVar9] = 1.0;
        uVar9 = uVar9 + 1;
      } while ((uint)nrows != uVar9);
    }
    if (0 < nnonz) {
      iVar11 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[this->numCol];
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_34 = 0;
      local_40 = (ulong)(uint)nrows;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_78,(long)this->numCol,&local_34)
      ;
      uVar9 = 0;
      do {
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[XARindex[uVar9]] =
             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[XARindex[uVar9]] + 1;
        uVar9 = uVar9 + 1;
      } while ((uint)nnonz != uVar9);
      sVar13 = (long)iVar11 + (long)nnonz;
      std::vector<int,_std::allocator<int>_>::resize(&this->Aindex,sVar13);
      std::vector<double,_std::allocator<double>_>::resize(&this->Avalue,sVar13);
      if (0 < (long)this->numCol) {
        piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_58 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + -1;
        local_60 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + -1;
        local_50 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        lVar8 = (long)this->numCol;
        do {
          uVar10 = (int)sVar13 -
                   local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8 + -1];
          lVar12 = (long)piVar5[lVar8];
          if (piVar5[lVar8 + -1] < piVar5[lVar8]) {
            lVar14 = 0;
            do {
              local_58[(int)uVar10 + lVar14] = local_58[lVar12 + lVar14];
              local_60[(int)uVar10 + lVar14] = local_60[lVar12 + lVar14];
              lVar1 = lVar12 + lVar14;
              lVar14 = lVar14 + -1;
            } while ((long)piVar5[lVar8 + -1] < lVar1 + -1);
            uVar10 = uVar10 + (int)lVar14;
            local_48 = sVar13;
          }
          piVar5[lVar8] = (int)sVar13;
          sVar13 = (size_type)uVar10;
          bVar7 = 1 < lVar8;
          lVar8 = lVar8 + -1;
        } while (bVar7);
      }
      if (0 < nrows) {
        piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = 0;
        do {
          iVar11 = nnonz;
          if ((long)uVar9 < (long)(nrows + -1)) {
            iVar11 = XARstart[uVar9 + 1];
          }
          lVar8 = (long)XARstart[uVar9];
          if (XARstart[uVar9] < iVar11) {
            do {
              lVar12 = (long)XARindex[lVar8];
              lVar14 = (long)piVar5[lVar12 + 1] -
                       (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar12];
              local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar12] =
                   local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar12] + -1;
              piVar6[lVar14] = this->numRow + (int)uVar9;
              pdVar2[lVar14] = XARvalue[lVar8];
              lVar8 = lVar8 + 1;
            } while (iVar11 != lVar8);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != local_40);
      }
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    iVar11 = this->numRow;
    this->numRow = iVar11 + nrows;
    this->numTot = this->numTot + nrows;
    extendWithLogicalBasis(this,this->numCol,-1,iVar11,iVar11 + nrows + -1);
  }
  return;
}

Assistant:

void HModel::util_addRows(int nrows, const double* XrowLower, const double* XrowUpper,
			  int nnonz, const int* XARstart, const int* XARindex, const double* XARvalue) {
  assert(nrows >= 0);
  assert(nnonz >= 0);
  assert(nnonz == 0 || numCol > 0);
#ifdef JAJH_dev
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n", nrows, nnonz);cout << flush;
#endif

#ifdef H2DEBUG
  printf("H2DEBUG is being set OK\n");
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n", nrows, nnonz);cout << flush;
#endif


  if (nrows==0) return;

  int nwNumRow = numRow + nrows;
  rowLower.resize(nwNumRow);
  rowUpper.resize(nwNumRow);
  rowScale.resize(nwNumRow);

  for (int row = 0; row < nrows; row++) {
    rowLower[numRow+row] = XrowLower[row];
    rowUpper[numRow+row] = XrowUpper[row];
    rowScale[numRow+row] = 1.0;
  }
  //NB SCIP doesn't have XARstart[nrows] defined, so have to use nnonz for last entry
  if (nnonz > 0) {
    int cuNnonz = Astart[numCol];
    vector<int> Alength;
    Alength.assign(numCol, 0);
    for (int el = 0; el < nnonz; el++) {
      int col = XARindex[el];
      //      printf("El %2d: adding entry in column %2d\n", el, col); cout << flush;
#ifdef H2DEBUG
      assert(col >= 0);
      assert(col < numCol);
#endif
      Alength[col]++;
    }
    //Determine the new number of nonzeros and resize the column-wise matrix arrays
    int nwNnonz = cuNnonz + nnonz;
    Aindex.resize(nwNnonz);
    Avalue.resize(nwNnonz);

    //Add the new rows
    //Shift the existing columns to make space for the new entries
    int nwEl = nwNnonz;
    for (int col = numCol-1; col >= 0; col--) {
      //printf("Column %2d has additional length %2d\n", col, Alength[col]);cout << flush;
      int AstartColp1 = nwEl;
      nwEl -= Alength[col];
      //printf("Shift: nwEl = %2d\n", nwEl); cout << flush;
      for (int el = Astart[col+1]-1; el >= Astart[col]; el--) {
	nwEl--;
	//printf("Shift: Over-writing Aindex[%2d] with Aindex[%2d]=%2d\n", nwEl, el, Aindex[el]); cout << flush;
	Aindex[nwEl] = Aindex[el];
	Avalue[nwEl] = Avalue[el];
      }
      Astart[col+1] = AstartColp1;
    }
    //printf("After shift: nwEl = %2d\n", nwEl); cout << flush;
    assert(nwEl == 0);
    //util_reportColMtx(numCol, Astart, Aindex, Avalue);

    //Insert the new entries
    for (int row = 0; row < nrows; row++) {
      int fEl = XARstart[row];
      int lEl = (row < nrows-1 ? XARstart[row+1] : nnonz) - 1;
      for (int el = fEl; el <= lEl; el++) {
	int col = XARindex[el];
	nwEl = Astart[col+1]-Alength[col];
	Alength[col]--;
	//printf("Insert: row = %2d; col = %2d; Astart[col+1]-Alength[col] = %2d; Alength[col] = %2d; nwEl = %2d\n", row, col, Astart[col+1]-Alength[col], Alength[col], nwEl); cout << flush;
	assert(nwEl >= 0);
	assert(el >= 0);
	//printf("Insert: Over-writing Aindex[%2d] with Aindex[%2d]=%2d\n", nwEl, el, Aindex[el]); cout << flush;
	Aindex[nwEl] = numRow + row;
	Avalue[nwEl] = XARvalue[el];
      }
    }
  }
  //Increase the number of rows and total number of variables in the model
  numRow += nrows;
  numTot += nrows;

  //Update the basis and work vectors correponding to new basic rows
  extendWithLogicalBasis(numCol, -1, numRow-nrows, numRow-1);

}